

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arg.h
# Opt level: O0

void __thiscall TCLAP::Arg::~Arg(Arg *this)

{
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__Arg_00170718;
  std::__cxx11::string::~string((string *)(in_RDI + 0xe));
  std::__cxx11::string::~string((string *)(in_RDI + 9));
  std::__cxx11::string::~string((string *)(in_RDI + 5));
  std::__cxx11::string::~string((string *)(in_RDI + 1));
  return;
}

Assistant:

inline Arg::~Arg() { }